

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (void *pNext,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value,
               DynamicStateInfo *dynamic_state_info)

{
  VkStructureType VVar1;
  bool bVar2;
  allocator local_89;
  string local_88;
  int local_64;
  undefined1 local_60 [8];
  Value next;
  bool ignored;
  VkBaseInStructure *pin;
  Value nexts;
  DynamicStateInfo *dynamic_state_info_local;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  void *pNext_local;
  
  nexts.data_.o.members = (Member *)dynamic_state_info;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&pin,kArrayType);
  alloc_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)pNext;
  do {
    alloc_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                  pnext_chain_skip_ignored_entries(alloc_local);
    if ((VkSamplerYcbcrConversionCreateInfo *)alloc_local ==
        (VkSamplerYcbcrConversionCreateInfo *)0x0) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::operator=(out_value,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&pin);
      pNext_local._7_1_ = 1;
      local_64 = 1;
      break;
    }
    next.data_.f.flags._1_1_ = 0;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_60);
    VVar1 = ((VkSamplerYcbcrConversionCreateInfo *)alloc_local)->sType;
    if (VVar1 == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO) {
LAB_0012da88:
      next.data_.f.flags._1_1_ = 1;
LAB_0012dd01:
      if ((next.data_.f.flags._1_1_ & 1) == 0) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&pin,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)local_60,alloc);
      }
      alloc_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                    ((VkSamplerYcbcrConversionCreateInfo *)alloc_local)->pNext;
      local_64 = 0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineRasterizationStateStreamCreateInfoEXT *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineRenderingCreateInfoKHR *)alloc_local,alloc,(Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkRenderPassMultiviewCreateInfo *)alloc_local,alloc,(Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineRobustnessCreateInfoEXT *)alloc_local,alloc,(Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineDiscardRectangleStateCreateInfoEXT *)alloc_local,alloc,
                         (Value *)local_60,(DynamicStateInfo *)nexts.data_.o.members);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineRasterizationConservativeStateCreateInfoEXT *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineRasterizationDepthClipStateCreateInfoEXT *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkRenderPassInputAttachmentAspectCreateInfo *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineTessellationDomainOriginStateCreateInfo *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkSamplerReductionModeCreateInfo *)alloc_local,alloc,(Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkSampleLocationsInfoEXT *)alloc_local,alloc,(Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineSampleLocationsStateCreateInfoEXT *)alloc_local,alloc,
                         (Value *)local_60,(DynamicStateInfo *)nexts.data_.o.members);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineColorBlendAdvancedStateCreateInfoEXT *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkSamplerYcbcrConversionCreateInfo *)alloc_local,alloc,(Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineVertexInputDivisorStateCreateInfoKHR *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkSubpassDescriptionDepthStencilResolve *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkRenderPassFragmentDensityMapCreateInfoEXT *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *)alloc_local,alloc
                         ,(Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkFragmentShadingRateAttachmentInfoKHR *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineFragmentShadingRateStateCreateInfoKHR *)alloc_local,alloc,
                         (Value *)local_60,(DynamicStateInfo *)nexts.data_.o.members);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkRenderingAttachmentLocationInfoKHR *)alloc_local,alloc,(Value *)local_60
                        );
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkRenderingInputAttachmentIndexInfoKHR *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkAttachmentReferenceStencilLayout *)alloc_local,alloc,(Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkAttachmentDescriptionStencilLayout *)alloc_local,alloc,(Value *)local_60
                        );
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == 
             VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *)alloc_local,
                         alloc,(Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineRasterizationLineStateCreateInfoKHR *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkDepthBiasRepresentationInfoEXT *)alloc_local,alloc,(Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkSamplerCustomBorderColorCreateInfoEXT *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineLibraryCreateInfoKHR *)alloc_local,alloc,true,(Value *)local_60)
      ;
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_MEMORY_BARRIER_2) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkMemoryBarrier2KHR *)alloc_local,alloc,(Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkGraphicsPipelineLibraryCreateInfoEXT *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkMutableDescriptorTypeCreateInfoEXT *)alloc_local,alloc,(Value *)local_60
                        );
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineViewportDepthClipControlCreateInfoEXT *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkMultisampledRenderToSingleSampledInfoEXT *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkPipelineColorWriteCreateInfoEXT *)alloc_local,alloc,(Value *)local_60,
                         (DynamicStateInfo *)nexts.data_.o.members);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkSamplerBorderColorComponentMappingCreateInfoEXT *)alloc_local,alloc,
                         (Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT) {
      bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((VkRenderPassCreationControlEXT *)alloc_local,alloc,(Value *)local_60);
      if (bVar2) goto LAB_0012dd01;
      pNext_local._7_1_ = 0;
      local_64 = 1;
    }
    else {
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT)
      goto LAB_0012da88;
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO) {
        bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          ((VkPipelineCreateFlags2CreateInfoKHR *)alloc_local,alloc,
                           (Value *)local_60);
        if (bVar2) goto LAB_0012dd01;
        pNext_local._7_1_ = 0;
        local_64 = 1;
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT) {
        bVar2 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          ((VkPipelineViewportDepthClampControlCreateInfoEXT *)alloc_local,alloc,
                           (Value *)local_60);
        if (bVar2) goto LAB_0012dd01;
        pNext_local._7_1_ = 0;
        local_64 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_88,"Unsupported pNext found, cannot hash sType.",&local_89);
        log_error_pnext_chain(&local_88,alloc_local);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
        pNext_local._7_1_ = 0;
        local_64 = 1;
      }
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_60);
  } while (local_64 == 0);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&pin);
  return (bool)(pNext_local._7_1_ & 1);
}

Assistant:

static bool pnext_chain_json_value(const void *pNext, Allocator &alloc, Value *out_value,
                                   const DynamicStateInfo *dynamic_state_info)
{
	Value nexts(kArrayType);

	while ((pNext = pnext_chain_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);
		bool ignored = false;
		Value next;

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
			if (!json_value(*static_cast<const VkPipelineTessellationDomainOriginStateCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineVertexInputDivisorStateCreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationStateStreamCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
			if (!json_value(*static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineColorBlendAdvancedStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationConservativeStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT:
			if (!json_value(*static_cast<const VkAttachmentDescriptionStencilLayout *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT:
			if (!json_value(*static_cast<const VkAttachmentReferenceStencilLayout *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
			if (!json_value(*static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
			if (!json_value(*static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineColorWriteCreateInfoEXT *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
			if (!json_value(*static_cast<const VkSamplerReductionModeCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
			if (!json_value(*static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineDiscardRectangleStateCreateInfoEXT *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
			if (!json_value(*static_cast<const VkMemoryBarrier2KHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineFragmentShadingRateStateCreateInfoKHR *>(pNext), alloc, &next, dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
			if (!json_value(*static_cast<const VkSamplerYcbcrConversionCreateInfo *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkGraphicsPipelineLibraryCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO:
		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT:
			// Ignored.
			ignored = true;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineLibraryCreateInfoKHR *>(pNext), alloc, true, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineViewportDepthClipControlCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
			if (!json_value(*static_cast<const VkPipelineCreateFlags2CreateInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
			if (!json_value(*static_cast<const VkRenderPassCreationControlEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkSamplerBorderColorComponentMappingCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
			if (!json_value(*static_cast<const VkMultisampledRenderToSingleSampledInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
			if (!json_value(*static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkRenderPassFragmentDensityMapCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
			if (!json_value(*static_cast<const VkSampleLocationsInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
			if (!json_value(*static_cast<const VkPipelineViewportDepthClampControlCreateInfoEXT *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
			if (!json_value(*static_cast<const VkRenderingAttachmentLocationInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
			if (!json_value(*static_cast<const VkRenderingInputAttachmentIndexInfoKHR *>(pNext), alloc, &next))
				return false;
			break;

		default:
			log_error_pnext_chain("Unsupported pNext found, cannot hash sType.", pNext);
			return false;
		}

		if (!ignored)
			nexts.PushBack(next, alloc);
		pNext = pin->pNext;
	}

	*out_value = nexts;
	return true;
}